

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDriver.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  pointer pbVar5;
  pointer pcVar6;
  bool bVar7;
  int *piVar8;
  long lVar9;
  uint *puVar10;
  ostream *poVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  long *plVar15;
  pointer pvVar16;
  long *plVar17;
  ulong uVar18;
  pointer pvVar19;
  long *plVar20;
  long *plVar21;
  pointer pvVar22;
  pointer *ppiVar23;
  long *plVar24;
  _Alloc_hider _Var25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_21;
  initializer_list<int> __l_22;
  initializer_list<int> __l_23;
  initializer_list<int> __l_24;
  initializer_list<int> __l_25;
  initializer_list<int> __l_26;
  initializer_list<int> __l_27;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_28;
  string validMapName;
  string invalidMapName;
  Map invalidMap;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  invalidBorderData;
  Map validMap;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  validBorderData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidCountryData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidContinentData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validCountryData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validContinentData;
  allocator_type local_48f;
  allocator_type local_48e;
  allocator_type local_48d;
  allocator_type local_48c;
  allocator_type local_48b;
  allocator_type local_48a;
  allocator_type local_489;
  long *local_488;
  long local_480;
  long local_478 [2];
  long *local_468;
  long local_460 [3];
  undefined1 local_448 [32];
  vector<int,_std::allocator<int>_> *local_428 [2];
  vector<int,_std::allocator<int>_> local_418;
  vector<int,_std::allocator<int>_> local_400;
  vector<int,_std::allocator<int>_> local_3e8;
  vector<int,_std::allocator<int>_> local_3d0;
  undefined1 local_3b8 [24];
  undefined1 local_3a0 [8];
  pointer local_398;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  long local_368 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  Map local_2f8;
  string local_2e0;
  string local_2c0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2a0;
  undefined8 local_288;
  undefined1 local_280 [32];
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  long *local_200 [2];
  long local_1f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  long *local_1a0 [2];
  long local_190 [2];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_180;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_150;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_138;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_120;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  long *local_b0 [2];
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_488 = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"vTest map","");
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"europe","");
  local_428[0] = &local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"2","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_448;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3b8,__l,(allocator_type *)&local_1e0);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"asia","");
  plVar17 = local_328;
  local_338[0] = plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4","");
  __l_00._M_len = 2;
  __l_00._M_array = &local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3a0,__l_00,(allocator_type *)&local_240);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_3b8;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_108,__l_01,(allocator_type *)&local_f0);
  lVar14 = 0x18;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3b8 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  lVar14 = -0x40;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x40;
  ppiVar23 = (pointer *)&local_418;
  do {
    if ((vector<int,_std::allocator<int>_> *)ppiVar23 !=
        (vector<int,_std::allocator<int>_> *)((_Vector_impl_data *)(ppiVar23 + -2))->_M_start) {
      operator_delete((vector<int,_std::allocator<int>_> *)
                      ((_Vector_impl_data *)(ppiVar23 + -2))->_M_start,(long)*ppiVar23 + 1);
    }
    ppiVar23 = ppiVar23 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"1","");
  plVar17 = local_328;
  local_338[0] = plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"france","");
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"1","");
  __l_02._M_len = 3;
  __l_02._M_array = &local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_448,__l_02,(allocator_type *)&local_f0);
  local_3b8._0_8_ = local_3b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"2","");
  local_398 = (pointer)local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_3a0 + 8),"germany","");
  plVar15 = local_368;
  local_378._M_allocated_capacity = (size_type)plVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_388 + 0x10),"1","");
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_448 + 0x18),__l_03,(allocator_type *)&local_90);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"3","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"russia","");
  plVar20 = local_190;
  local_1a0[0] = plVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"2","");
  __l_04._M_len = 3;
  __l_04._M_array = &local_1e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_418,__l_04,(allocator_type *)&local_468);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"4","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"dawd","");
  plVar24 = local_1f0;
  local_200[0] = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"2","");
  __l_05._M_len = 3;
  __l_05._M_array = &local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_400,__l_05,(allocator_type *)&local_2a0);
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)local_448;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_150,__l_06,(allocator_type *)&local_2f8);
  lVar14 = 0x48;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_448 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  lVar14 = -0x60;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  do {
    if (plVar20 != (long *)plVar20[-2]) {
      operator_delete((long *)plVar20[-2],*plVar20 + 1);
    }
    plVar20 = plVar20 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  plVar15 = local_308;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  local_1e0._M_dataplus._M_p = (pointer)0x200000001;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_1e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_448,__l_07,(allocator_type *)&local_f0);
  local_358._M_dataplus._M_p = (pointer)0x100000002;
  local_358._M_string_length._0_4_ = 3;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)&local_358;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_448 + 0x18),__l_08,
             (allocator_type *)&local_90);
  local_3b8._0_8_ = (pointer)0x200000003;
  local_3b8._8_4_ = 4;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_3b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_418,__l_09,(allocator_type *)&local_468);
  local_240._M_dataplus._M_p = (pointer)0x300000004;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&local_240;
  std::vector<int,_std::allocator<int>_>::vector(&local_400,__l_10,(allocator_type *)&local_2f8);
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)local_448;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_2a0,__l_11,(allocator_type *)&local_168);
  lVar14 = 0x60;
  do {
    pvVar3 = *(void **)((long)local_460 + lVar14);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)(local_448 + lVar14 + -8) - (long)pvVar3);
    }
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != 0);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_488,local_480 + (long)local_488);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_120,&local_108);
  Map::Map(&local_2f8,&local_260,&local_120);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar8 = __errno_location();
    pvVar16 = local_150.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar4 = (((pvVar16->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      iVar1 = *piVar8;
      *piVar8 = 0;
      lVar14 = strtol(pcVar4,(char **)local_448,10);
      if ((char *)local_448._0_8_ == pcVar4) {
        std::__throw_invalid_argument("stoi");
LAB_0010374f:
        std::__throw_out_of_range("stoi");
LAB_0010375b:
        std::__throw_invalid_argument("stoi");
LAB_00103767:
        std::__throw_out_of_range("stoi");
        goto LAB_00103773;
      }
      if ((lVar14 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_0010374f;
      if (*piVar8 == 0) {
        *piVar8 = iVar1;
      }
      pbVar5 = (pvVar16->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      pcVar6 = pbVar5[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,pcVar6,pcVar6 + pbVar5[1]._M_string_length);
      pcVar4 = (pvVar16->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      iVar1 = *piVar8;
      *piVar8 = 0;
      lVar9 = strtol(pcVar4,(char **)local_448,10);
      if ((char *)local_448._0_8_ == pcVar4) goto LAB_0010375b;
      if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_00103767;
      if (*piVar8 == 0) {
        *piVar8 = iVar1;
      }
      Map::addNode(&local_2f8,(int)lVar14,&local_2e0,(int)lVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      pvVar16 = pvVar16 + 1;
    } while (pvVar16 !=
             local_150.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_2a0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2a0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar22 = local_2a0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      piVar8 = (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (4 < (ulong)((long)(pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar8)) {
        uVar13 = 1;
        uVar18 = 2;
        do {
          Map::addEdge(&local_2f8,*piVar8,piVar8[uVar13]);
          piVar8 = (pvVar22->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          bVar7 = uVar18 < (ulong)((long)(pvVar22->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >>
                                  2);
          uVar13 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar7);
      }
      pvVar22 = pvVar22 + 1;
    } while (pvVar22 !=
             local_2a0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_468 = local_460 + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"vTest map","");
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"europe","");
  local_428[0] = &local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"2","");
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)local_448;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3b8,__l_12,(allocator_type *)&local_1e0);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"asia","");
  local_338[0] = plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4","");
  __l_13._M_len = 2;
  __l_13._M_array = &local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3a0,__l_13,(allocator_type *)&local_240);
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)local_3b8;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_168,__l_14,(allocator_type *)&local_f0);
  lVar14 = 0x18;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3b8 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  lVar14 = -0x40;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x40;
  ppiVar23 = (pointer *)&local_418;
  do {
    if ((vector<int,_std::allocator<int>_> *)ppiVar23 !=
        (vector<int,_std::allocator<int>_> *)((_Vector_impl_data *)(ppiVar23 + -2))->_M_start) {
      operator_delete((vector<int,_std::allocator<int>_> *)
                      ((_Vector_impl_data *)(ppiVar23 + -2))->_M_start,(long)*ppiVar23 + 1);
    }
    ppiVar23 = ppiVar23 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"1","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"france","");
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"1","");
  __l_15._M_len = 3;
  __l_15._M_array = &local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_448,__l_15,(allocator_type *)&local_288);
  local_3b8._0_8_ = local_3b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"2","");
  local_398 = (pointer)local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_3a0 + 8),"germany","");
  plVar17 = local_368;
  local_378._M_allocated_capacity = (size_type)plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_388 + 0x10),"1","");
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_448 + 0x18),__l_16,&local_48a);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"3","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"russia","");
  plVar15 = local_190;
  local_1a0[0] = plVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"2","");
  __l_17._M_len = 3;
  __l_17._M_array = &local_1e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_418,__l_17,&local_48b);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"4","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"kongo","");
  plVar20 = local_1f0;
  local_200[0] = plVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"1","");
  __l_18._M_len = 3;
  __l_18._M_array = &local_240;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_400,__l_18,&local_48c);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"5","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"lebanon","");
  plVar24 = local_a0;
  local_b0[0] = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"2","");
  __l_19._M_len = 3;
  __l_19._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_3e8,__l_19,&local_48d);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"6","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"nepal","");
  plVar21 = local_40;
  local_50[0] = plVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"2","");
  __l_20._M_len = 3;
  __l_20._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_3d0,__l_20,&local_48e);
  __l_21._M_len = 6;
  __l_21._M_array = (iterator)local_448;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_180,__l_21,&local_48f);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_448 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  lVar14 = -0x60;
  do {
    if (plVar21 != (long *)plVar21[-2]) {
      operator_delete((long *)plVar21[-2],*plVar21 + 1);
    }
    plVar21 = plVar21 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  do {
    if (plVar20 != (long *)plVar20[-2]) {
      operator_delete((long *)plVar20[-2],*plVar20 + 1);
    }
    plVar20 = plVar20 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  lVar14 = -0x60;
  plVar17 = local_308;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  local_3b8._0_8_ = (pointer)0x200000001;
  __l_22._M_len = 2;
  __l_22._M_array = (iterator)local_3b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_448,__l_22,(allocator_type *)&local_48a);
  local_1e0._M_dataplus._M_p = (pointer)0x300000002;
  __l_23._M_len = 2;
  __l_23._M_array = (iterator)&local_1e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_448 + 0x18),__l_23,
             (allocator_type *)&local_48b);
  local_240._M_dataplus._M_p = (pointer)0x100000003;
  __l_24._M_len = 2;
  __l_24._M_array = (iterator)&local_240;
  std::vector<int,_std::allocator<int>_>::vector(&local_418,__l_24,(allocator_type *)&local_48c);
  local_f0._M_dataplus._M_p = (pointer)0x500000004;
  __l_25._M_len = 2;
  __l_25._M_array = (iterator)&local_f0;
  std::vector<int,_std::allocator<int>_>::vector(&local_400,__l_25,(allocator_type *)&local_48d);
  local_90._M_dataplus._M_p = (pointer)0x600000005;
  __l_26._M_len = 2;
  __l_26._M_array = (iterator)&local_90;
  std::vector<int,_std::allocator<int>_>::vector(&local_3e8,__l_26,(allocator_type *)&local_48e);
  local_288 = 0x400000006;
  __l_27._M_len = 2;
  __l_27._M_array = (iterator)&local_288;
  std::vector<int,_std::allocator<int>_>::vector(&local_3d0,__l_27,(allocator_type *)&local_48f);
  __l_28._M_len = 6;
  __l_28._M_array = (iterator)local_448;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_358,__l_28,&local_489);
  lVar14 = 0x90;
  do {
    pvVar3 = *(void **)((long)local_460 + lVar14);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)(local_448 + lVar14 + -8) - (long)pvVar3);
    }
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != 0);
  local_280._0_8_ = (pointer)(local_280 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,local_468,local_460[0] + (long)local_468);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_138,&local_168);
  Map::Map((Map *)local_448,(string *)local_280,&local_138);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_138);
  if ((pointer)local_280._0_8_ != (pointer)(local_280 + 0x10)) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  if (local_180.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar10 = (uint *)__errno_location();
    pvVar19 = local_180.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pbVar5 = (pointer)(((pvVar19->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      uVar2 = *puVar10;
      pvVar16 = (pointer)(ulong)uVar2;
      *puVar10 = 0;
      lVar14 = strtol((char *)pbVar5,(char **)local_3b8,10);
      if ((pointer)local_3b8._0_8_ == pbVar5) {
LAB_00103773:
        std::__throw_invalid_argument("stoi");
LAB_0010377f:
        std::__throw_out_of_range("stoi");
LAB_0010378b:
        std::__throw_invalid_argument("stoi");
LAB_00103797:
        uVar12 = std::__throw_out_of_range("stoi");
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_138);
        if ((pointer)local_280._0_8_ != pvVar16) {
          operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&local_358);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_180);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_168);
        if (local_468 != local_460 + 1) {
          operator_delete(local_468,local_460[1] + 1);
        }
        Map::~Map(&local_2f8);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_2a0);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_150);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_108);
        if (local_488 != local_478) {
          operator_delete(local_488,local_478[0] + 1);
        }
        _Unwind_Resume(uVar12);
      }
      if ((lVar14 - 0x80000000U < 0xffffffff00000000) || (*puVar10 == 0x22)) goto LAB_0010377f;
      if (*puVar10 == 0) {
        *puVar10 = uVar2;
      }
      pbVar5 = (pvVar19->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      pcVar6 = pbVar5[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,pcVar6,pcVar6 + pbVar5[1]._M_string_length);
      pbVar5 = (pointer)(pvVar19->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      uVar2 = *puVar10;
      pvVar16 = (pointer)(ulong)uVar2;
      *puVar10 = 0;
      lVar9 = strtol((char *)pbVar5,(char **)local_3b8,10);
      if ((pointer)local_3b8._0_8_ == pbVar5) goto LAB_0010378b;
      if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*puVar10 == 0x22)) goto LAB_00103797;
      if (*puVar10 == 0) {
        *puVar10 = uVar2;
      }
      Map::addNode((Map *)local_448,(int)lVar14,&local_2c0,(int)lVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pvVar19 = pvVar19 + 1;
    } while (pvVar19 !=
             local_180.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar4 = (char *)CONCAT44(local_358._M_string_length._4_4_,(undefined4)local_358._M_string_length)
  ;
  if (local_358._M_dataplus._M_p != pcVar4) {
    _Var25._M_p = local_358._M_dataplus._M_p;
    do {
      piVar8 = *(int **)_Var25._M_p;
      if (4 < (ulong)(*(long *)(_Var25._M_p + 8) - (long)piVar8)) {
        uVar13 = 1;
        uVar18 = 2;
        do {
          Map::addEdge((Map *)local_448,*piVar8,piVar8[uVar13]);
          piVar8 = *(int **)_Var25._M_p;
          bVar7 = uVar18 < (ulong)(*(long *)(_Var25._M_p + 8) - (long)piVar8 >> 2);
          uVar13 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar7);
      }
      _Var25._M_p = _Var25._M_p + 0x18;
    } while (_Var25._M_p != pcVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing valid map...\n Connected : ",0x22);
  Map::testConnected(&local_2f8);
  poVar11 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing invalid map...\n Connected : ",0x24);
  Map::testConnected((Map *)local_448);
  poVar11 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  Map::~Map((Map *)local_448);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_358);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_180);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_168);
  if (local_468 != local_460 + 1) {
    operator_delete(local_468,local_460[1] + 1);
  }
  Map::~Map(&local_2f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_2a0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_150);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_108);
  if (local_488 != local_478) {
    operator_delete(local_488,local_478[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    //more extensive tests are performed in the MapLoader (on the data being submitted)

    //declare valid map information
    std::string validMapName = "vTest map";
    std::vector<std::vector<std::string>> validContinentData = {{"europe", "2"},
                                                                {"asia",   "4"}};
    std::vector<std::vector<std::string>> validCountryData = {{"1", "france",  "1"},
                                                              {"2", "germany", "1"},
                                                              {"3", "russia",  "2"},
                                                              {"4","dawd", "2"}};
    std::vector<std::vector<int>> validBorderData = {{1, 2},
                                                     {2, 1, 3},
                                                     {3, 2, 4},
                                                     {4, 3}};
    //create map object with empty continents
    Map validMap = Map(validMapName, validContinentData);
    //add countries to map and continents
    for (auto& i : validCountryData) {
        validMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : validBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            validMap.addEdge(i[0], i[j]);
        }
    }

    //declare invalid map information
    std::string invalidMapName = "vTest map";
    std::vector<std::vector<std::string>> invalidContinentData = {{"europe", "2"},
                                                                  {"asia",   "4"}};
    std::vector<std::vector<std::string>> invalidCountryData = {{"1", "france",  "1"},
                                                                {"2", "germany", "1"},
                                                                {"3", "russia",  "2"},
                                                                {"4", "kongo",  "1"},
                                                                {"5", "lebanon",  "2"},
                                                                {"6", "nepal",  "2"}};
    std::vector<std::vector<int>> invalidBorderData = {{1, 2},
                                                       {2, 3},
                                                       {3, 1},
                                                       {4,5},
                                                       {5,6},
                                                       {6,4}};
    //create map object with empty continents
    Map invalidMap = Map(invalidMapName, invalidContinentData);
    //add countries to map and continents
    for (auto& i : invalidCountryData) {
        invalidMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : invalidBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            invalidMap.addEdge(i[0], i[j]);
        }
    }

    //test maps
//    validMap.printMap();
//    invalidMap.printMap();
    std::cout << "Testing valid map...\n Connected : " << validMap.testConnected() << "\n";
    std::cout << "Testing invalid map...\n Connected : " << invalidMap.testConnected() << "\n";
    return 0;
}